

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O2

int ffg3db(fitsfile *fptr,long group,uchar nulval,LONGLONG ncols,LONGLONG nrows,LONGLONG naxis1,
          LONGLONG naxis2,LONGLONG naxis3,uchar *array,int *anynul,int *status)

{
  long nelem;
  int iVar1;
  long lVar2;
  long firstelem;
  uchar *array_00;
  long lVar3;
  bool bVar4;
  uchar nullvalue;
  long local_c0;
  fitsfile *local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  LONGLONG local_98;
  ulong local_90;
  char cdummy;
  LONGLONG local_80;
  LONGLONG local_78;
  LONGLONG fpixel [3];
  long inc [3];
  
  inc[0] = 1;
  inc[1] = 1;
  firstelem = 1;
  inc[2] = 1;
  fpixel[0] = 1;
  fpixel[1] = 1;
  fpixel[2] = 1;
  local_c0 = naxis1;
  iVar1 = fits_is_compressed_image(fptr,status);
  nelem = local_c0;
  if (iVar1 == 0) {
    if (group < 2) {
      group = firstelem;
    }
    local_b8 = fptr;
    if (nrows != naxis2 || ncols != local_c0) {
      if (nrows < naxis2 || ncols < local_c0) {
        *status = 0x140;
        return 0x140;
      }
      local_a0 = (nrows - naxis2) * ncols;
      local_c0 = 0;
      local_b0 = naxis2;
      if (naxis2 < 1) {
        local_b0 = local_c0;
      }
      local_a8 = naxis3;
      if (naxis3 < 1) {
        local_a8 = local_c0;
      }
      local_90 = (ulong)nulval;
      lVar3 = 0;
      local_98 = group;
      for (; local_c0 != local_a8; local_c0 = local_c0 + 1) {
        lVar2 = local_a0 + lVar3;
        array_00 = array + lVar3;
        lVar3 = local_b0;
        while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
          iVar1 = ffgclb(fptr,2,group,firstelem,nelem,1,1,(uchar)local_90,array_00,&cdummy,anynul,
                         status);
          if (0 < iVar1) goto LAB_00182dc7;
          firstelem = firstelem + nelem;
          lVar2 = lVar2 + ncols;
          array_00 = array_00 + ncols;
          group = local_98;
          fptr = local_b8;
        }
        lVar3 = lVar2;
      }
LAB_00182dc7:
      return *status;
    }
    ffgclb(fptr,2,group,1,nrows * ncols * naxis3,1,1,nulval,array,&cdummy,anynul,status);
  }
  else {
    local_78 = naxis3;
    nullvalue = nulval;
    _cdummy = ncols;
    local_80 = nrows;
    fits_read_compressed_img
              (fptr,0xb,fpixel,(LONGLONG *)&cdummy,inc,1,&nullvalue,array,(char *)0x0,anynul,status)
    ;
  }
  return *status;
}

Assistant:

int ffg3db(fitsfile *fptr,  /* I - FITS file pointer                       */
           long  group,     /* I - group to read (1 = 1st group)           */
           unsigned char nulval, /* set undefined pixels equal to this     */
           LONGLONG  ncols,     /* I - number of pixels in each row of array   */
           LONGLONG  nrows,     /* I - number of rows in each plane of array   */
           LONGLONG  naxis1,    /* I - FITS image NAXIS1 value                 */
           LONGLONG  naxis2,    /* I - FITS image NAXIS2 value                 */
           LONGLONG  naxis3,    /* I - FITS image NAXIS3 value                 */
           unsigned char *array, /* O - array to be filled and returned    */
           int  *anynul,    /* O - set to 1 if any values are null; else 0 */
           int  *status)    /* IO - error status                           */
/*
  Read an entire 3-D array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being read).  Any null
  values in the array will be set equal to the value of nulval, unless
  nulval = 0 in which case no null checking will be performed.
*/
{
    long tablerow, ii, jj;
    LONGLONG narray, nfits;
    char cdummy;
    int  nullcheck = 1;
    long inc[] = {1,1,1};
    LONGLONG fpixel[] = {1,1,1};
    LONGLONG lpixel[3];
    unsigned char nullvalue;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        lpixel[0] = ncols;
        lpixel[1] = nrows;
        lpixel[2] = naxis3;
        nullvalue = nulval;  /* set local variable */

        fits_read_compressed_img(fptr, TBYTE, fpixel, lpixel, inc,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */
    tablerow=maxvalue(1,group);

    if (ncols == naxis1 && nrows == naxis2)  /* arrays have same size? */
    {
       /* all the image pixels are contiguous, so read all at once */
       ffgclb(fptr, 2, tablerow, 1, naxis1 * naxis2 * naxis3, 1, 1, nulval,
               array, &cdummy, anynul, status);
       return(*status);
    }

    if (ncols < naxis1 || nrows < naxis2)
       return(*status = BAD_DIMEN);

    nfits = 1;   /* next pixel in FITS image to read */
    narray = 0;  /* next pixel in output array to be filled */

    /* loop over naxis3 planes in the data cube */
    for (jj = 0; jj < naxis3; jj++)
    {
      /* loop over the naxis2 rows in the FITS image, */
      /* reading naxis1 pixels to each row            */

      for (ii = 0; ii < naxis2; ii++)
      {
       if (ffgclb(fptr, 2, tablerow, nfits, naxis1, 1, 1, nulval,
          &array[narray], &cdummy, anynul, status) > 0)
          return(*status);

       nfits += naxis1;
       narray += ncols;
      }
      narray += (nrows - naxis2) * ncols;
    }

    return(*status);
}